

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::sse2::SphereMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Scene *pSVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  bool bVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  RTCIntersectArguments *pRVar22;
  RTCRayN *pRVar23;
  RTCFilterFunctionN p_Var24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar46;
  uint uVar47;
  float fVar51;
  float fVar53;
  float fVar55;
  undefined1 auVar48 [16];
  uint uVar52;
  uint uVar54;
  uint uVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar62;
  float fVar63;
  undefined1 auVar61 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 in_XMM13 [16];
  undefined1 auVar80 [16];
  float fVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  RTCFilterFunctionNArguments local_1e8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  uint local_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  uint local_d8 [4];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar11 = context->scene;
  uVar82 = sphere->sharedGeomID;
  uVar27 = (ulong)(sphere->primIDs).field_0.i[0];
  pGVar12 = (pSVar11->geometries).items[uVar82].ptr;
  local_1f8 = pGVar12->fnumTimeSegments;
  fVar33 = (pGVar12->time_range).lower;
  fVar33 = ((*(float *)(ray + k * 4 + 0x70) - fVar33) / ((pGVar12->time_range).upper - fVar33)) *
           local_1f8;
  local_1b8 = ZEXT416((uint)fVar33);
  fVar33 = floorf(fVar33);
  if (local_1f8 + -1.0 <= fVar33) {
    fVar33 = local_1f8 + -1.0;
  }
  fVar67 = 0.0;
  if (0.0 <= fVar33) {
    fVar67 = fVar33;
  }
  fVar75 = (float)local_1b8._0_4_ - fVar67;
  lVar30 = *(long *)&pGVar12[2].numPrimitives;
  lVar25 = (long)(int)fVar67 * 0x38;
  lVar13 = *(long *)(lVar30 + lVar25);
  lVar14 = *(long *)(lVar30 + 0x10 + lVar25);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar27);
  uVar26 = (ulong)(sphere->primIDs).field_0.i[1];
  pfVar2 = (float *)(lVar13 + lVar14 * uVar26);
  uVar28 = (ulong)(sphere->primIDs).field_0.i[2];
  pfVar3 = (float *)(lVar13 + lVar14 * uVar28);
  uVar29 = (ulong)(sphere->primIDs).field_0.i[3];
  pfVar4 = (float *)(lVar13 + lVar14 * uVar29);
  lVar13 = *(long *)(lVar30 + 0x38 + lVar25);
  lVar30 = *(long *)(lVar30 + 0x48 + lVar25);
  pfVar5 = (float *)(lVar13 + uVar27 * lVar30);
  pfVar6 = (float *)(lVar13 + uVar26 * lVar30);
  pfVar7 = (float *)(lVar13 + uVar28 * lVar30);
  pfVar8 = (float *)(lVar13 + lVar30 * uVar29);
  fVar34 = 1.0 - fVar75;
  fVar35 = fVar34 * pfVar1[3] + fVar75 * pfVar5[3];
  fVar43 = fVar34 * pfVar2[3] + fVar75 * pfVar6[3];
  fVar44 = fVar34 * pfVar3[3] + fVar75 * pfVar7[3];
  fVar45 = fVar34 * pfVar4[3] + fVar75 * pfVar8[3];
  local_1b8._0_8_ = sphere;
  uVar83 = (uint)sphere->numPrimitives;
  local_d8[0] = uVar82;
  local_d8[1] = uVar82;
  local_d8[2] = uVar82;
  local_d8[3] = uVar82;
  fVar33 = *(float *)(ray + k * 4);
  fVar67 = *(float *)(ray + k * 4 + 0x10);
  fVar74 = *(float *)(ray + k * 4 + 0x20);
  fVar68 = (*pfVar1 * fVar34 + *pfVar5 * fVar75) - fVar33;
  fVar69 = (*pfVar2 * fVar34 + *pfVar6 * fVar75) - fVar33;
  fVar70 = (*pfVar3 * fVar34 + *pfVar7 * fVar75) - fVar33;
  fVar33 = (*pfVar4 * fVar34 + *pfVar8 * fVar75) - fVar33;
  local_1f8 = (pfVar1[1] * fVar34 + pfVar5[1] * fVar75) - fVar67;
  fVar65 = (pfVar2[1] * fVar34 + pfVar6[1] * fVar75) - fVar67;
  fVar66 = (pfVar3[1] * fVar34 + pfVar7[1] * fVar75) - fVar67;
  fVar67 = (pfVar4[1] * fVar34 + pfVar8[1] * fVar75) - fVar67;
  fVar71 = (pfVar1[2] * fVar34 + pfVar5[2] * fVar75) - fVar74;
  fVar72 = (pfVar2[2] * fVar34 + pfVar6[2] * fVar75) - fVar74;
  fVar73 = (pfVar3[2] * fVar34 + pfVar7[2] * fVar75) - fVar74;
  fVar74 = (pfVar4[2] * fVar34 + pfVar8[2] * fVar75) - fVar74;
  fVar34 = *(float *)(ray + k * 4 + 0x40);
  fVar75 = *(float *)(ray + k * 4 + 0x50);
  fVar76 = *(float *)(ray + k * 4 + 0x60);
  fVar59 = fVar75 * fVar75 + fVar76 * fVar76;
  auVar80._0_4_ = fVar34 * fVar34 + fVar59;
  auVar80._4_4_ = auVar80._0_4_;
  auVar80._8_4_ = auVar80._0_4_;
  auVar80._12_4_ = auVar80._0_4_;
  auVar61 = rcpps(ZEXT416((uint)fVar59),auVar80);
  fVar46 = auVar61._0_4_;
  fVar51 = auVar61._4_4_;
  fVar53 = auVar61._8_4_;
  fVar55 = auVar61._12_4_;
  fVar46 = (1.0 - auVar80._0_4_ * fVar46) * fVar46 + fVar46;
  fVar51 = (1.0 - auVar80._0_4_ * fVar51) * fVar51 + fVar51;
  fVar53 = (1.0 - auVar80._0_4_ * fVar53) * fVar53 + fVar53;
  fVar55 = (1.0 - auVar80._0_4_ * fVar55) * fVar55 + fVar55;
  fVar59 = (fVar68 * fVar34 + local_1f8 * fVar75 + fVar71 * fVar76) * fVar46;
  fVar77 = (fVar69 * fVar34 + fVar65 * fVar75 + fVar72 * fVar76) * fVar51;
  fVar78 = (fVar70 * fVar34 + fVar66 * fVar75 + fVar73 * fVar76) * fVar53;
  fVar79 = (fVar33 * fVar34 + fVar67 * fVar75 + fVar74 * fVar76) * fVar55;
  fVar68 = fVar68 - fVar34 * fVar59;
  fVar69 = fVar69 - fVar34 * fVar77;
  fVar70 = fVar70 - fVar34 * fVar78;
  fVar33 = fVar33 - fVar34 * fVar79;
  local_1f8 = local_1f8 - fVar75 * fVar59;
  fVar65 = fVar65 - fVar75 * fVar77;
  fVar66 = fVar66 - fVar75 * fVar78;
  fVar67 = fVar67 - fVar75 * fVar79;
  fVar71 = fVar71 - fVar76 * fVar59;
  fVar72 = fVar72 - fVar76 * fVar77;
  fVar73 = fVar73 - fVar76 * fVar78;
  fVar74 = fVar74 - fVar76 * fVar79;
  fVar60 = fVar68 * fVar68 + local_1f8 * local_1f8 + fVar71 * fVar71;
  fVar62 = fVar69 * fVar69 + fVar65 * fVar65 + fVar72 * fVar72;
  fVar63 = fVar70 * fVar70 + fVar66 * fVar66 + fVar73 * fVar73;
  fVar64 = fVar33 * fVar33 + fVar67 * fVar67 + fVar74 * fVar74;
  fVar35 = fVar35 * fVar35;
  fVar43 = fVar43 * fVar43;
  fVar44 = fVar44 * fVar44;
  fVar45 = fVar45 * fVar45;
  bVar18 = uVar83 != 0 && fVar60 <= fVar35;
  auVar61._0_4_ = -(uint)bVar18;
  bVar19 = 1 < uVar83 && fVar62 <= fVar43;
  auVar61._4_4_ = -(uint)bVar19;
  bVar32 = 2 < uVar83 && fVar63 <= fVar44;
  auVar61._8_4_ = -(uint)bVar32;
  bVar31 = 3 < uVar83 && fVar64 <= fVar45;
  auVar61._12_4_ = -(uint)bVar31;
  iVar20 = movmskps(uVar83,auVar61);
  if (iVar20 != 0) {
    auVar48._0_4_ = fVar46 * (fVar35 - fVar60);
    auVar48._4_4_ = fVar51 * (fVar43 - fVar62);
    auVar48._8_4_ = fVar53 * (fVar44 - fVar63);
    auVar48._12_4_ = fVar55 * (fVar45 - fVar64);
    auVar80 = sqrtps(in_XMM13,auVar48);
    fVar53 = auVar80._0_4_;
    fVar44 = fVar59 - fVar53;
    fVar55 = auVar80._4_4_;
    fVar45 = fVar77 - fVar55;
    fVar60 = auVar80._8_4_;
    fVar46 = fVar78 - fVar60;
    fVar62 = auVar80._12_4_;
    fVar51 = fVar79 - fVar62;
    fVar59 = fVar59 + fVar53;
    fVar77 = fVar77 + fVar55;
    fVar78 = fVar78 + fVar60;
    fVar79 = fVar79 + fVar62;
    fVar35 = *(float *)(ray + k * 4 + 0x30);
    fVar43 = *(float *)(ray + k * 4 + 0x80);
    uVar82 = -(uint)(fVar44 <= fVar43 && fVar35 <= fVar44);
    uVar83 = -(uint)(fVar45 <= fVar43 && fVar35 <= fVar45);
    uVar84 = -(uint)(fVar46 <= fVar43 && fVar35 <= fVar46);
    uVar85 = -(uint)(fVar51 <= fVar43 && fVar35 <= fVar51);
    uVar47 = uVar82 & auVar61._0_4_;
    uVar52 = uVar83 & auVar61._4_4_;
    auVar57._4_4_ = uVar52;
    auVar57._0_4_ = uVar47;
    uVar54 = uVar84 & auVar61._8_4_;
    uVar56 = uVar85 & auVar61._12_4_;
    uVar86 = -(uint)((fVar59 <= fVar43 && fVar35 <= fVar59) && bVar18);
    uVar87 = -(uint)((fVar77 <= fVar43 && fVar35 <= fVar77) && bVar19);
    uVar88 = -(uint)((fVar78 <= fVar43 && fVar35 <= fVar78) && bVar32);
    uVar89 = -(uint)((fVar79 <= fVar43 && fVar35 <= fVar79) && bVar31);
    auVar57._8_4_ = uVar54;
    auVar57._12_4_ = uVar56;
    auVar17._4_4_ = uVar87;
    auVar17._0_4_ = uVar86;
    auVar17._8_4_ = uVar88;
    auVar17._12_4_ = uVar89;
    uVar21 = movmskps(iVar20,auVar57 | auVar17);
    if (uVar21 != 0) {
      auVar58._0_4_ = ~uVar47 & (uint)fVar59;
      auVar58._4_4_ = ~uVar52 & (uint)fVar77;
      auVar58._8_4_ = ~uVar54 & (uint)fVar78;
      auVar58._12_4_ = ~uVar56 & (uint)fVar79;
      auVar36._0_4_ = (uint)fVar44 & uVar47;
      auVar36._4_4_ = (uint)fVar45 & uVar52;
      auVar36._8_4_ = (uint)fVar46 & uVar54;
      auVar36._12_4_ = (uint)fVar51 & uVar56;
      fVar35 = (float)(~uVar47 & (uint)fVar53 | (uint)-fVar53 & uVar47);
      fVar43 = (float)(~uVar52 & (uint)fVar55 | (uint)-fVar55 & uVar52);
      fVar44 = (float)(~uVar54 & (uint)fVar60 | (uint)-fVar60 & uVar54);
      fVar45 = (float)(~uVar56 & (uint)fVar62 | (uint)-fVar62 & uVar56);
      local_198._0_4_ = fVar34 * fVar35 - fVar68;
      local_198._4_4_ = fVar34 * fVar43 - fVar69;
      fStack_190 = fVar34 * fVar44 - fVar70;
      fStack_18c = fVar34 * fVar45 - fVar33;
      local_188._0_4_ = fVar75 * fVar35 - local_1f8;
      local_188._4_4_ = fVar75 * fVar43 - fVar65;
      fStack_180 = fVar75 * fVar44 - fVar66;
      fStack_17c = fVar75 * fVar45 - fVar67;
      local_178._0_4_ = fVar35 * fVar76 - fVar71;
      local_178._4_4_ = fVar43 * fVar76 - fVar72;
      fStack_170 = fVar44 * fVar76 - fVar73;
      fStack_16c = fVar45 * fVar76 - fVar74;
      _local_1a8 = auVar36 | auVar58;
      uVar27 = (ulong)(uVar21 & 0xff);
      lVar30 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar61 = _DAT_01feba00;
      fVar35 = fVar34;
      fVar43 = fVar34;
      fVar44 = fVar34;
      fVar45 = fVar75;
      fVar46 = fVar75;
      fVar51 = fVar75;
      fVar53 = fVar76;
      fVar55 = fVar76;
      fVar60 = fVar76;
      do {
        local_1e8.hit = (RTCHitN *)local_c8;
        uVar26 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        local_68 = local_d8[uVar26];
        pGVar12 = (pSVar11->geometries).items[local_68].ptr;
        pRVar22 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        local_1e8.ray = (RTCRayN *)ray;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
          bVar31 = true;
        }
        else {
          pRVar22 = context->args;
          if ((pRVar22->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar31 = false;
          }
          else {
            local_1fc = *(undefined4 *)(ray + k * 4 + 0x80);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar26 * 4);
            local_1e8.context = context->user;
            uVar9 = *(undefined4 *)(local_1b8._0_8_ + 0x10 + uVar26 * 4);
            local_78._4_4_ = uVar9;
            local_78._0_4_ = uVar9;
            local_78._8_4_ = uVar9;
            local_78._12_4_ = uVar9;
            local_c8._4_4_ = *(undefined4 *)(local_198 + uVar26 * 4);
            local_b8._4_4_ = *(undefined4 *)(local_188 + uVar26 * 4);
            local_a8 = *(undefined4 *)(local_178 + uVar26 * 4);
            local_c8._0_4_ = local_c8._4_4_;
            local_c8._8_4_ = local_c8._4_4_;
            local_c8._12_4_ = local_c8._4_4_;
            local_b8._0_4_ = local_b8._4_4_;
            local_b8._8_4_ = local_b8._4_4_;
            local_b8._12_4_ = local_b8._4_4_;
            uStack_a4 = local_a8;
            uStack_a0 = local_a8;
            uStack_9c = local_a8;
            local_88 = 0;
            uStack_80 = 0;
            local_98 = 0;
            uStack_90 = 0;
            uStack_64 = local_68;
            uStack_60 = local_68;
            uStack_5c = local_68;
            uStack_54 = (local_1e8.context)->instID[0];
            local_58 = uStack_54;
            uStack_50 = uStack_54;
            uStack_4c = uStack_54;
            uStack_44 = (local_1e8.context)->instPrimID[0];
            local_48 = uStack_44;
            uStack_40 = uStack_44;
            uStack_3c = uStack_44;
            local_218 = *(undefined8 *)(mm_lookupmask_ps + lVar30);
            uStack_210 = *(undefined8 *)(mm_lookupmask_ps + lVar30 + 8);
            local_1e8.valid = (int *)&local_218;
            local_1e8.geometryUserPtr = pGVar12->userPtr;
            local_1e8.N = 4;
            p_Var24 = pGVar12->occlusionFilterN;
            local_e8 = fVar68;
            fStack_e4 = fVar69;
            fStack_e0 = fVar70;
            fStack_dc = fVar33;
            local_f8 = fVar71;
            fStack_f4 = fVar72;
            fStack_f0 = fVar73;
            fStack_ec = fVar74;
            local_108 = fVar34;
            fStack_104 = fVar35;
            fStack_100 = fVar43;
            fStack_fc = fVar44;
            local_118 = fVar75;
            fStack_114 = fVar45;
            fStack_110 = fVar46;
            fStack_10c = fVar51;
            local_128 = fVar76;
            fStack_124 = fVar53;
            fStack_120 = fVar55;
            fStack_11c = fVar60;
            local_138 = fVar59;
            fStack_134 = fVar77;
            fStack_130 = fVar78;
            fStack_12c = fVar79;
            local_148 = auVar80;
            local_158 = uVar82;
            uStack_154 = uVar83;
            uStack_150 = uVar84;
            uStack_14c = uVar85;
            local_168 = uVar86;
            uStack_164 = uVar87;
            uStack_160 = uVar88;
            uStack_15c = uVar89;
            fStack_1f4 = fVar65;
            fStack_1f0 = fVar66;
            fStack_1ec = fVar67;
            if (p_Var24 != (RTCFilterFunctionN)0x0) {
              p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1e8);
              auVar61 = _DAT_01feba00;
            }
            auVar38._8_4_ = 0xffffffff;
            auVar38._0_8_ = 0xffffffffffffffff;
            auVar38._12_4_ = 0xffffffff;
            auVar37._0_4_ = -(uint)((int)local_218 == 0);
            auVar37._4_4_ = -(uint)(local_218._4_4_ == 0);
            auVar37._8_4_ = -(uint)((int)uStack_210 == 0);
            auVar37._12_4_ = -(uint)(uStack_210._4_4_ == 0);
            uVar82 = movmskps((int)p_Var24,auVar37);
            pRVar23 = (RTCRayN *)(ulong)(uVar82 ^ 0xf);
            if ((uVar82 ^ 0xf) == 0) {
              auVar38 = auVar37 ^ auVar38;
            }
            else {
              p_Var24 = context->args->filter;
              if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var24)(&local_1e8);
                auVar38._8_4_ = 0xffffffff;
                auVar38._0_8_ = 0xffffffffffffffff;
                auVar38._12_4_ = 0xffffffff;
                auVar61 = _DAT_01feba00;
              }
              auVar49._0_4_ = -(uint)((int)local_218 == 0);
              auVar49._4_4_ = -(uint)(local_218._4_4_ == 0);
              auVar49._8_4_ = -(uint)((int)uStack_210 == 0);
              auVar49._12_4_ = -(uint)(uStack_210._4_4_ == 0);
              auVar38 = auVar49 ^ auVar38;
              *(undefined1 (*) [16])(local_1e8.ray + 0x80) =
                   ~auVar49 & auVar61 | *(undefined1 (*) [16])(local_1e8.ray + 0x80) & auVar49;
              pRVar23 = local_1e8.ray;
            }
            auVar39._0_4_ = auVar38._0_4_ << 0x1f;
            auVar39._4_4_ = auVar38._4_4_ << 0x1f;
            auVar39._8_4_ = auVar38._8_4_ << 0x1f;
            auVar39._12_4_ = auVar38._12_4_ << 0x1f;
            uVar82 = movmskps((int)pRVar23,auVar39);
            pRVar22 = (RTCIntersectArguments *)(ulong)uVar82;
            bVar31 = uVar82 == 0;
            fVar34 = local_108;
            fVar35 = fStack_104;
            fVar43 = fStack_100;
            fVar44 = fStack_fc;
            fVar65 = fStack_1f4;
            fVar66 = fStack_1f0;
            fVar67 = fStack_1ec;
            fVar68 = local_e8;
            fVar69 = fStack_e4;
            fVar70 = fStack_e0;
            fVar33 = fStack_dc;
            fVar71 = local_f8;
            fVar72 = fStack_f4;
            fVar73 = fStack_f0;
            fVar74 = fStack_ec;
            fVar75 = local_118;
            fVar45 = fStack_114;
            fVar46 = fStack_110;
            fVar51 = fStack_10c;
            fVar76 = local_128;
            fVar53 = fStack_124;
            fVar55 = fStack_120;
            fVar60 = fStack_11c;
            fVar59 = local_138;
            fVar77 = fStack_134;
            fVar78 = fStack_130;
            fVar79 = fStack_12c;
            auVar80 = local_148;
            uVar82 = local_158;
            uVar83 = uStack_154;
            uVar84 = uStack_150;
            uVar85 = uStack_14c;
            uVar86 = local_168;
            uVar87 = uStack_164;
            uVar88 = uStack_160;
            uVar89 = uStack_15c;
            if (bVar31) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1fc;
              uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
            }
          }
        }
      } while ((bVar31 != false) && (uVar27 != 0));
      fVar62 = *(float *)(ray + k * 4 + 0x80);
      auVar16._4_4_ = uVar83 & -(uint)(fVar77 <= fVar62) & uVar87;
      auVar16._0_4_ = uVar82 & -(uint)(fVar59 <= fVar62) & uVar86;
      auVar16._8_4_ = uVar84 & -(uint)(fVar78 <= fVar62) & uVar88;
      auVar16._12_4_ = uVar85 & -(uint)(fVar79 <= fVar62) & uVar89;
      uVar82 = movmskps((int)pRVar22,auVar16);
      if (uVar82 == 0) {
        return (bool)(bVar31 ^ 1U);
      }
      fVar62 = auVar80._0_4_;
      fVar63 = auVar80._4_4_;
      fVar64 = auVar80._8_4_;
      fVar81 = auVar80._12_4_;
      local_1a8._4_4_ = fVar77;
      local_1a8._0_4_ = fVar59;
      fStack_1a0 = fVar78;
      fStack_19c = fVar79;
      local_198._4_4_ = fVar35 * fVar63 - fVar69;
      local_198._0_4_ = fVar34 * fVar62 - fVar68;
      fStack_190 = fVar43 * fVar64 - fVar70;
      fStack_18c = fVar44 * fVar81 - fVar33;
      local_188._4_4_ = fVar45 * fVar63 - fVar65;
      local_188._0_4_ = fVar75 * fVar62 - local_1f8;
      fStack_180 = fVar46 * fVar64 - fVar66;
      fStack_17c = fVar51 * fVar81 - fVar67;
      local_178._4_4_ = fVar53 * fVar63 - fVar72;
      local_178._0_4_ = fVar76 * fVar62 - fVar71;
      fStack_170 = fVar55 * fVar64 - fVar73;
      fStack_16c = fVar60 * fVar81 - fVar74;
      pSVar11 = context->scene;
      lVar30 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      uVar27 = (ulong)(uVar82 & 0xff);
      do {
        local_1e8.hit = (RTCHitN *)local_c8;
        uVar26 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
        local_68 = local_d8[uVar26];
        pGVar12 = (pSVar11->geometries).items[local_68].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
          bVar32 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar32 = false;
        }
        else {
          local_1f8 = *(float *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar26 * 4);
          local_1e8.context = context->user;
          local_78._4_4_ = *(undefined4 *)(local_1b8._0_8_ + 0x10 + uVar26 * 4);
          uVar9 = *(undefined4 *)(local_198 + uVar26 * 4);
          uVar10 = *(undefined4 *)(local_188 + uVar26 * 4);
          local_a8 = *(undefined4 *)(local_178 + uVar26 * 4);
          local_c8._4_4_ = uVar9;
          local_c8._0_4_ = uVar9;
          local_c8._8_4_ = uVar9;
          local_c8._12_4_ = uVar9;
          local_b8._4_4_ = uVar10;
          local_b8._0_4_ = uVar10;
          local_b8._8_4_ = uVar10;
          local_b8._12_4_ = uVar10;
          uStack_a4 = local_a8;
          uStack_a0 = local_a8;
          uStack_9c = local_a8;
          local_88 = 0;
          uStack_80 = 0;
          local_98 = 0;
          uStack_90 = 0;
          local_78._0_4_ = local_78._4_4_;
          local_78._8_4_ = local_78._4_4_;
          local_78._12_4_ = local_78._4_4_;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          uStack_54 = (local_1e8.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_44 = (local_1e8.context)->instPrimID[0];
          local_48 = uStack_44;
          uStack_40 = uStack_44;
          uStack_3c = uStack_44;
          local_218 = *(undefined8 *)(mm_lookupmask_ps + lVar30);
          uStack_210 = *(undefined8 *)(mm_lookupmask_ps + lVar30 + 8);
          local_1e8.valid = (int *)&local_218;
          local_1e8.geometryUserPtr = pGVar12->userPtr;
          local_1e8.N = 4;
          p_Var24 = pGVar12->occlusionFilterN;
          local_1e8.ray = (RTCRayN *)ray;
          if (p_Var24 != (RTCFilterFunctionN)0x0) {
            p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&local_1e8);
            auVar61 = _DAT_01feba00;
          }
          auVar40._0_4_ = -(uint)((int)local_218 == 0);
          auVar40._4_4_ = -(uint)(local_218._4_4_ == 0);
          auVar40._8_4_ = -(uint)((int)uStack_210 == 0);
          auVar40._12_4_ = -(uint)(uStack_210._4_4_ == 0);
          uVar82 = movmskps((int)p_Var24,auVar40);
          pRVar23 = (RTCRayN *)(ulong)(uVar82 ^ 0xf);
          if ((uVar82 ^ 0xf) == 0) {
            auVar15._8_4_ = 0xffffffff;
            auVar15._0_8_ = 0xffffffffffffffff;
            auVar15._12_4_ = 0xffffffff;
            auVar41 = auVar40 ^ auVar15;
          }
          else {
            p_Var24 = context->args->filter;
            if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var24)(&local_1e8);
              auVar61 = _DAT_01feba00;
            }
            auVar50._0_4_ = -(uint)((int)local_218 == 0);
            auVar50._4_4_ = -(uint)(local_218._4_4_ == 0);
            auVar50._8_4_ = -(uint)((int)uStack_210 == 0);
            auVar50._12_4_ = -(uint)(uStack_210._4_4_ == 0);
            auVar41._8_4_ = 0xffffffff;
            auVar41._0_8_ = 0xffffffffffffffff;
            auVar41._12_4_ = 0xffffffff;
            auVar41 = auVar50 ^ auVar41;
            *(undefined1 (*) [16])(local_1e8.ray + 0x80) =
                 ~auVar50 & auVar61 | *(undefined1 (*) [16])(local_1e8.ray + 0x80) & auVar50;
            pRVar23 = local_1e8.ray;
          }
          auVar42._0_4_ = auVar41._0_4_ << 0x1f;
          auVar42._4_4_ = auVar41._4_4_ << 0x1f;
          auVar42._8_4_ = auVar41._8_4_ << 0x1f;
          auVar42._12_4_ = auVar41._12_4_ << 0x1f;
          iVar20 = movmskps((int)pRVar23,auVar42);
          bVar32 = iVar20 == 0;
          if (bVar32) {
            *(float *)(ray + k * 4 + 0x80) = local_1f8;
            uVar27 = uVar27 ^ 1L << (uVar26 & 0x3f);
          }
        }
      } while ((bVar32 != false) && (uVar27 != 0));
      return (bool)(bVar31 ^ 1U | bVar32 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom, ray.time()[k]);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }